

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::namespace_uri(xpath_node *node)

{
  xml_attribute_struct *pxVar1;
  namespace_uri_predicate pred_00;
  xml_attribute xVar2;
  char_t *name;
  char *name_00;
  xml_node_struct *pxVar3;
  namespace_uri_predicate pred_01;
  namespace_uri_predicate pred;
  xml_node local_40;
  namespace_uri_predicate local_38;
  
  pxVar1 = (node->_attribute)._attr;
  if (pxVar1 == (xml_attribute_struct *)0x0) {
    pxVar3 = (node->_node)._root;
    name_00 = "";
    if (pxVar3 != (xml_node_struct *)0x0) {
      name_00 = "";
      if (pxVar3->name != (char_t *)0x0) {
        name_00 = pxVar3->name;
      }
    }
    namespace_uri_predicate::namespace_uri_predicate(&local_38,name_00);
    pred_00.prefix_length = local_38.prefix_length;
    pred_00.prefix = local_38.prefix;
    for (; pxVar3 != (xml_node_struct *)0x0; pxVar3 = pxVar3->parent) {
      local_40._root = pxVar3;
      xVar2 = xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
                        (&local_40,pred_00);
      if (xVar2._attr != (xml_attribute_struct *)0x0) goto LAB_0011ec8d;
    }
  }
  else {
    pxVar3 = (node->_node)._root;
    name = pxVar1->name;
    if (name == (char_t *)0x0) {
      name = "";
    }
    namespace_uri_predicate::namespace_uri_predicate(&local_38,name);
    if (local_38.prefix != (char_t *)0x0) {
      for (; pxVar3 != (xml_node_struct *)0x0; pxVar3 = pxVar3->parent) {
        pred_01.prefix_length = local_38.prefix_length;
        pred_01.prefix = local_38.prefix;
        local_40._root = pxVar3;
        xVar2 = xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
                          (&local_40,pred_01);
        if (xVar2._attr != (xml_attribute_struct *)0x0) {
LAB_0011ec8d:
          if ((xVar2._attr)->value == (char_t *)0x0) {
            return "";
          }
          return (xVar2._attr)->value;
        }
      }
    }
  }
  return "";
}

Assistant:

PUGI__FN xml_attribute xpath_node::attribute() const
	{
		return _attribute;
	}